

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall
cmServer::WriteJsonObject(cmServer *this,cmConnection *connection,Value *jsonValue,DebugInfo *debug)

{
  Int value;
  uint64_t uVar1;
  long lVar2;
  Value *pVVar3;
  ulong uVar4;
  char *pcVar5;
  size_t __n;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 local_3d0 [8];
  ofstream myfile;
  Value local_1b0;
  Value local_188;
  Value local_160;
  Value local_138;
  Value local_110;
  uint64_t local_e8;
  uint64_t endTime;
  Value stats;
  Value copy;
  string result;
  uint64_t beforeJson;
  FastWriter writer;
  DebugInfo *debug_local;
  Value *jsonValue_local;
  cmConnection *connection_local;
  cmServer *this_local;
  
  writer._40_8_ = debug;
  Json::FastWriter::FastWriter((FastWriter *)&beforeJson);
  uVar1 = uv_hrtime();
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)&copy.limit_,(int)&beforeJson,jsonValue,(size_t)debug);
  if (writer._40_8_ != 0) {
    Json::Value::Value((Value *)&stats.limit_,jsonValue);
    if ((*(byte *)writer._40_8_ & 1) != 0) {
      Json::Value::Value((Value *)&endTime,objectValue);
      local_e8 = uv_hrtime();
      lVar2 = local_e8 - uVar1;
      auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar6._0_8_ = lVar2;
      auVar6._12_4_ = 0x45300000;
      Json::Value::Value(&local_110,
                         ((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0
                        );
      pVVar3 = Json::Value::operator[]((Value *)&endTime,"jsonSerialization");
      Json::Value::operator=(pVVar3,&local_110);
      Json::Value::~Value(&local_110);
      __n = *(size_t *)(writer._40_8_ + 0x28);
      lVar2 = local_e8 - __n;
      auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar7._0_8_ = lVar2;
      auVar7._12_4_ = 0x45300000;
      Json::Value::Value(&local_138,
                         ((auVar7._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0
                        );
      pVVar3 = Json::Value::operator[]((Value *)&endTime,"totalTime");
      Json::Value::operator=(pVVar3,&local_138);
      Json::Value::~Value(&local_138);
      value = std::__cxx11::string::size();
      Json::Value::Value(&local_160,value);
      pVVar3 = Json::Value::operator[]((Value *)&endTime,"size");
      Json::Value::operator=(pVVar3,&local_160);
      Json::Value::~Value(&local_160);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        Json::Value::Value(&local_188,(string *)(writer._40_8_ + 8));
        pVVar3 = Json::Value::operator[]((Value *)&endTime,"dumpFile");
        Json::Value::operator=(pVVar3,&local_188);
        Json::Value::~Value(&local_188);
      }
      Json::Value::Value(&local_1b0,(Value *)&endTime);
      pVVar3 = Json::Value::operator[]((Value *)&stats.limit_,"zzzDebug");
      Json::Value::operator=(pVVar3,&local_1b0);
      Json::Value::~Value(&local_1b0);
      Json::FastWriter::write_abi_cxx11_
                ((FastWriter *)&myfile.field_0x1f8,(int)&beforeJson,&stats.limit_,__n);
      std::__cxx11::string::operator=((string *)&copy.limit_,(string *)&myfile.field_0x1f8);
      std::__cxx11::string::~string((string *)&myfile.field_0x1f8);
      Json::Value::~Value((Value *)&endTime);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_3d0,pcVar5,_S_out);
      std::operator<<((ostream *)local_3d0,(string *)&copy.limit_);
      std::ofstream::~ofstream(local_3d0);
    }
    Json::Value::~Value((Value *)&stats.limit_);
  }
  (**connection->_vptr_cmConnection)(connection,&copy.limit_);
  std::__cxx11::string::~string((string *)&copy.limit_);
  Json::FastWriter::~FastWriter((FastWriter *)&beforeJson);
  return;
}

Assistant:

void cmServer::WriteJsonObject(cmConnection* connection,
                               const Json::Value& jsonValue,
                               const DebugInfo* debug) const
{
  Json::FastWriter writer;

  auto beforeJson = uv_hrtime();
  std::string result = writer.write(jsonValue);

  if (debug) {
    Json::Value copy = jsonValue;
    if (debug->PrintStatistics) {
      Json::Value stats = Json::objectValue;
      auto endTime = uv_hrtime();

      stats["jsonSerialization"] = double(endTime - beforeJson) / 1000000.0;
      stats["totalTime"] = double(endTime - debug->StartTime) / 1000000.0;
      stats["size"] = static_cast<int>(result.size());
      if (!debug->OutputFile.empty()) {
        stats["dumpFile"] = debug->OutputFile;
      }

      copy["zzzDebug"] = stats;

      result = writer.write(copy); // Update result to include debug info
    }

    if (!debug->OutputFile.empty()) {
      cmsys::ofstream myfile(debug->OutputFile.c_str());
      myfile << result;
    }
  }

  connection->WriteData(result);
}